

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_href(ASMState *as,IRIns *ir,IROp merge)

{
  byte bVar1;
  MCLabel target;
  MCLabel target_00;
  MCode *pMVar2;
  bool bVar3;
  Reg r;
  Reg rb;
  IRIns *ir_00;
  MCLabel source;
  uint uVar4;
  bool bVar5;
  uint32_t local_a8;
  RegSet local_a4;
  int32_t local_90;
  uint uStack_8c;
  TValue k;
  MCLabel l_next;
  MCLabel l_loop;
  MCLabel l_end;
  uint32_t khash;
  IRType1 kt;
  int isk;
  IRIns *irkey;
  uint local_50;
  Reg tmp;
  Reg key;
  Reg tab;
  Reg dest;
  int destused;
  RegSet allow;
  IROp merge_local;
  IRIns *ir_local;
  ASMState *as_local;
  
  bVar5 = true;
  if (((ir->field_1).r & 0x80) != 0) {
    bVar5 = (ir->field_1).s != '\0';
  }
  r = ra_dest(as,ir,0xbfef);
  uVar4 = (1 << ((byte)r & 0x1f) ^ 0xffffffffU) & 0xbfef;
  rb = ra_alloc1(as,(uint)(ir->field_0).op1,uVar4);
  local_50 = 0x80;
  irkey._4_4_ = 0x80;
  ir_00 = as->ir + (ir->field_0).op2;
  bVar3 = 0x7fff < (ir->field_0).op2;
  bVar1 = (byte)(ir_00->field_0).ot;
  if (bVar3) {
    uVar4 = (1 << ((byte)rb & 0x1f) ^ 0xffffffffU) & uVar4;
    local_a4 = uVar4;
    if ((bVar1 & 0x1f) == 0xe) {
      local_a4 = 0xffff0000;
    }
    local_50 = ra_alloc1(as,(uint)(ir->field_0).op2,local_a4);
    irkey._4_4_ = ra_scratch(as,uVar4 & (1 << ((byte)local_50 & 0x1f) ^ 0xffffffffU));
  }
  target = as->mcp;
  if (merge == IR_NE) {
    asm_guardcc(as,4);
  }
  else if (bVar5) {
    emit_loadu64(as,r,(uint64_t)(as->J[-1].penalty + 0x34));
  }
  source = emit_sjcc_label(as,5);
  emit_rr(as,XO_TEST,r | 0x80200,r);
  emit_rmro(as,XO_MOV,r | 0x80200,r,0x10);
  target_00 = as->mcp;
  if (merge == IR_EQ) {
    asm_guardcc(as,4);
  }
  else {
    emit_sjcc(as,4,target);
  }
  if ((bVar1 & 0x1f) == 0xe) {
    if (bVar3) {
      emit_sjcc(as,10,target_00);
      emit_rmro(as,XO_UCOMISD,local_50,r,8);
      emit_sjcc(as,3,target_00);
      pMVar2 = as->mcp;
      as->mcp = pMVar2 + -1;
      pMVar2[-1] = 0xf2;
      emit_rmro(as,XO_ARITHi8,7,r,0xc);
    }
    else {
      emit_gmroi(as,0x838107,r,8,ir_00[1].i);
      emit_sjcc(as,5,target_00);
      emit_gmroi(as,0x838107,r,0xc,*(int32_t *)((long)ir_00 + 0xc));
    }
  }
  else if ((bVar1 & 0x1f) - 3 < 10) {
    if (bVar3) {
      emit_rmro(as,XO_CMP,irkey._4_4_ | 0x80200,r,8);
    }
    else {
      uStack_8c = (uint)(((ulong)((ir_00->field_1).t.irt & 0x1f ^ 0xffffffff) << 0x2f) >> 0x20) |
                  SUB84(ir_00[1].gcr,4);
      local_90 = ir_00[1].i;
      emit_gmroi(as,0x838107,r,8,local_90);
      emit_sjcc(as,5,target_00);
      emit_gmroi(as,0x838107,r,0xc,uStack_8c);
    }
  }
  else {
    *(uint *)(as->mcp + -4) = (bVar1 & 0x1f ^ 0xffffffff) << 0xf | 0x7fff;
    as->mcp = as->mcp + -4;
    emit_rmro(as,XO_ARITHi,7,r,0xc);
  }
  emit_sfixup(as,source);
  if (as->mcp < as->mclim) {
    asm_mclimit(as);
  }
  if ((bVar3) && ((bVar1 & 0x1f) - 3 < 10)) {
    emit_rr(as,XO_OR,irkey._4_4_ | 0x80200,local_50);
    emit_loadu64(as,irkey._4_4_,(ulong)(bVar1 & 0x1f ^ 0xffffffff) << 0x2f);
  }
  if (bVar3) {
    local_a8 = 1;
  }
  else {
    local_a8 = ir_khash(as,ir_00);
  }
  if (local_a8 == 0) {
    emit_rmro(as,XO_MOV,r | 0x80200,rb,0x28);
  }
  else {
    emit_rmro(as,0x30000fe,r | 0x80200,rb,0x28);
    pMVar2 = as->mcp;
    as->mcp = pMVar2 + -1;
    pMVar2[-1] = '\x03';
    emit_rr(as,XO_SHIFTi,4,r);
    emit_rmrxo(as,XO_LEA,r,r,r,XM_OFS8,0);
    if (bVar3) {
      if ((bVar1 & 0x1f) == 4) {
        emit_rmro(as,0x230000fe,r,local_50,0xc);
        emit_rmro(as,XO_MOV,r,rb,0x34);
      }
      else {
        emit_rmro(as,0x230000fe,r,rb,0x34);
        emit_rr(as,0x2b0000fe,r,irkey._4_4_);
        pMVar2 = as->mcp;
        as->mcp = pMVar2 + -1;
        pMVar2[-1] = '\r';
        emit_rr(as,XO_SHIFTi,0,irkey._4_4_);
        emit_rr(as,0x330000fe,r,irkey._4_4_);
        pMVar2 = as->mcp;
        as->mcp = pMVar2 + -1;
        pMVar2[-1] = '\x05';
        emit_rr(as,XO_SHIFTi,0,r);
        emit_rr(as,0x2b0000fe,irkey._4_4_,r);
        pMVar2 = as->mcp;
        as->mcp = pMVar2 + -1;
        pMVar2[-1] = '\x0e';
        emit_rr(as,XO_SHIFTi,0,r);
        emit_rr(as,0x330000fe,irkey._4_4_,r);
        if ((bVar1 & 0x1f) == 0xe) {
          emit_rr(as,0x30000fe,r,r);
          pMVar2 = as->mcp;
          as->mcp = pMVar2 + -1;
          pMVar2[-1] = ' ';
          emit_rr(as,XO_SHIFTi,0x80205,r);
          emit_rr(as,XO_MOV,irkey._4_4_,r);
          emit_rr(as,XO_MOVDto,local_50 | 0x80200,r);
        }
        else {
          emit_rr(as,XO_MOV,irkey._4_4_,local_50);
          if (as->mcp < as->mclim) {
            asm_mclimit(as);
          }
          emit_gri(as,0x838106,r,(bVar1 & 0x1f ^ 0xffffffff) << 0xf);
          if ((as->flags & 0x40) == 0) {
            pMVar2 = as->mcp;
            as->mcp = pMVar2 + -1;
            pMVar2[-1] = ' ';
            emit_rr(as,XO_SHIFTi,0x80205,r);
            emit_rr(as,XO_MOV,r | 0x80200,local_50 | 0x80200);
          }
          else {
            pMVar2 = as->mcp;
            as->mcp = pMVar2 + -1;
            pMVar2[-1] = ' ';
            emit_mrm(as,0xf0fbe3c4,r,local_50);
          }
        }
      }
    }
    else {
      emit_gri(as,0x838104,r,local_a8);
      emit_rmro(as,XO_MOV,r,rb,0x34);
    }
  }
  return;
}

Assistant:

static void asm_href(ASMState *as, IRIns *ir, IROp merge)
{
  RegSet allow = RSET_GPR;
  int destused = ra_used(ir);
  Reg dest = ra_dest(as, ir, allow);
  Reg tab = ra_alloc1(as, ir->op1, rset_clear(allow, dest));
  Reg key = RID_NONE, tmp = RID_NONE;
  IRIns *irkey = IR(ir->op2);
  int isk = irref_isk(ir->op2);
  IRType1 kt = irkey->t;
  uint32_t khash;
  MCLabel l_end, l_loop, l_next;

  if (!isk) {
    rset_clear(allow, tab);
    key = ra_alloc1(as, ir->op2, irt_isnum(kt) ? RSET_FPR : allow);
    if (LJ_GC64 || !irt_isstr(kt))
      tmp = ra_scratch(as, rset_exclude(allow, key));
  }

  /* Key not found in chain: jump to exit (if merged) or load niltv. */
  l_end = emit_label(as);
  if (merge == IR_NE)
    asm_guardcc(as, CC_E);  /* XI_JMP is not found by lj_asm_patchexit. */
  else if (destused)
    emit_loada(as, dest, niltvg(J2G(as->J)));

  /* Follow hash chain until the end. */
  l_loop = emit_sjcc_label(as, CC_NZ);
  emit_rr(as, XO_TEST, dest|REX_GC64, dest);
  emit_rmro(as, XO_MOV, dest|REX_GC64, dest, offsetof(Node, next));
  l_next = emit_label(as);

  /* Type and value comparison. */
  if (merge == IR_EQ)
    asm_guardcc(as, CC_E);
  else
    emit_sjcc(as, CC_E, l_end);
  if (irt_isnum(kt)) {
    if (isk) {
      /* Assumes -0.0 is already canonicalized to +0.0. */
      emit_gmroi(as, XG_ARITHi(XOg_CMP), dest, offsetof(Node, key.u32.lo),
		 (int32_t)ir_knum(irkey)->u32.lo);
      emit_sjcc(as, CC_NE, l_next);
      emit_gmroi(as, XG_ARITHi(XOg_CMP), dest, offsetof(Node, key.u32.hi),
		 (int32_t)ir_knum(irkey)->u32.hi);
    } else {
      emit_sjcc(as, CC_P, l_next);
      emit_rmro(as, XO_UCOMISD, key, dest, offsetof(Node, key.n));
      emit_sjcc(as, CC_AE, l_next);
      /* The type check avoids NaN penalties and complaints from Valgrind. */
#if LJ_64 && !LJ_GC64
      emit_u32(as, LJ_TISNUM);
      emit_rmro(as, XO_ARITHi, XOg_CMP, dest, offsetof(Node, key.it));
#else
      emit_i8(as, LJ_TISNUM);
      emit_rmro(as, XO_ARITHi8, XOg_CMP, dest, offsetof(Node, key.it));
#endif
    }
#if LJ_64 && !LJ_GC64
  } else if (irt_islightud(kt)) {
    emit_rmro(as, XO_CMP, key|REX_64, dest, offsetof(Node, key.u64));
#endif
#if LJ_GC64
  } else if (irt_isaddr(kt)) {
    if (isk) {
      TValue k;
      k.u64 = ((uint64_t)irt_toitype(irkey->t) << 47) | irkey[1].tv.u64;
      emit_gmroi(as, XG_ARITHi(XOg_CMP), dest, offsetof(Node, key.u32.lo),
		 k.u32.lo);
      emit_sjcc(as, CC_NE, l_next);
      emit_gmroi(as, XG_ARITHi(XOg_CMP), dest, offsetof(Node, key.u32.hi),
		 k.u32.hi);
    } else {
      emit_rmro(as, XO_CMP, tmp|REX_64, dest, offsetof(Node, key.u64));
    }
  } else {
    lj_assertA(irt_ispri(kt) && !irt_isnil(kt), "bad HREF key type");
    emit_u32(as, (irt_toitype(kt)<<15)|0x7fff);
    emit_rmro(as, XO_ARITHi, XOg_CMP, dest, offsetof(Node, key.it));
#else
  } else {
    if (!irt_ispri(kt)) {
      lj_assertA(irt_isaddr(kt), "bad HREF key type");
      if (isk)
	emit_gmroi(as, XG_ARITHi(XOg_CMP), dest, offsetof(Node, key.gcr),
		   ptr2addr(ir_kgc(irkey)));
      else
	emit_rmro(as, XO_CMP, key, dest, offsetof(Node, key.gcr));
      emit_sjcc(as, CC_NE, l_next);
    }
    lj_assertA(!irt_isnil(kt), "bad HREF key type");
    emit_i8(as, irt_toitype(kt));
    emit_rmro(as, XO_ARITHi8, XOg_CMP, dest, offsetof(Node, key.it));
#endif
  }